

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_recalc_psize(mcpl_outfile_t of)

{
  int iVar1;
  long in_RDI;
  uint fp;
  mcpl_outfileinternal_t *f;
  
  iVar1 = 8;
  if (*(int *)(in_RDI + 0x50) != 0) {
    iVar1 = 4;
  }
  *(int *)(in_RDI + 0x70) = iVar1 * 7;
  if (*(int *)(in_RDI + 0x4c) != 0) {
    *(int *)(in_RDI + 0x70) = iVar1 * 3 + *(int *)(in_RDI + 0x70);
  }
  if (*(int *)(in_RDI + 0x54) == 0) {
    *(int *)(in_RDI + 0x70) = *(int *)(in_RDI + 0x70) + 4;
  }
  if ((*(double *)(in_RDI + 0x58) == 0.0) && (!NAN(*(double *)(in_RDI + 0x58)))) {
    *(int *)(in_RDI + 0x70) = iVar1 + *(int *)(in_RDI + 0x70);
  }
  if (*(int *)(in_RDI + 0x48) != 0) {
    *(int *)(in_RDI + 0x70) = *(int *)(in_RDI + 0x70) + 4;
  }
  if (0x60 < *(uint *)(in_RDI + 0x70)) {
    mcpl_error((char *)0x1017f7);
  }
  *(uint *)(in_RDI + 0x80) =
       *(int *)(in_RDI + 0x50) + *(int *)(in_RDI + 0x4c) * 2 +
       (uint)(*(int *)(in_RDI + 0x54) != 0) * 4 + (uint)(*(double *)(in_RDI + 0x58) != 0.0) * 8 +
       *(int *)(in_RDI + 0x48) * 0x10;
  return;
}

Assistant:

MCPL_LOCAL void mcpl_recalc_psize(mcpl_outfile_t of)
{
  MCPLIMP_OUTFILEDECODE;
  unsigned fp = f->opt_singleprec ? sizeof(float) : sizeof(double);
  f->particle_size = 7*fp;
  if (f->opt_polarisation)
    f->particle_size += 3*fp;
  if (!f->opt_universalpdgcode)
    f->particle_size += sizeof(int32_t);
  if (!f->opt_universalweight)
    f->particle_size += fp;
  if (f->opt_userflags)
    f->particle_size += sizeof(uint32_t);
  if ( ! (f->particle_size<=MCPLIMP_MAX_PARTICLE_SIZE) )
    mcpl_error("unexpected particle size");
  f->opt_signature = 0
    + 1 * f->opt_singleprec
    + 2 * f->opt_polarisation
    + 4 * (f->opt_universalpdgcode?1:0)
    + 8 * (f->opt_universalweight?1:0)
    + 16 * f->opt_userflags;
}